

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelationship,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcRoot *this;
  
  this = (IfcRoot *)operator_new(0xb0);
  *(undefined ***)&this->field_0x98 = &PTR__Object_00836880;
  this[1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x0;
  this[1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = (_WordT)"IfcRelationship";
  Assimp::IFC::Schema_2x3::IfcRoot::IfcRoot(this,&PTR_construction_vtable_24__0083a8c8);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>)._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcRelationship_0083a860;
  *(undefined ***)&this->field_0x98 = &PTR__IfcRelationship_0083a8b0;
  *(undefined ***)&this->field_0x88 = &PTR__IfcRelationship_0083a888;
  GenericFill<Assimp::IFC::Schema_2x3::IfcRelationship>(db,params,(IfcRelationship *)this);
  return (Object *)
         ((long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>).
                 _vptr_ObjectHelper +
         (long)(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>)._vptr_ObjectHelper
               [-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }